

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall libtorrent::aux::torrent::update_gauge(torrent *this)

{
  uint uVar1;
  int c;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint uVar3;
  
  c = current_stats_state(this);
  uVar1 = c - 0xd3;
  uVar3 = *(uint *)&this->field_0x600 >> 1 & 0xf;
  if (uVar1 != uVar3) {
    if (uVar3 != 0xf) {
      iVar2 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[0x4b])();
      counters::inc_stats_counter((counters *)CONCAT44(extraout_var,iVar2),uVar3 + 0xd3,-1);
    }
    if (uVar1 != 0xf) {
      iVar2 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[0x4b])();
      counters::inc_stats_counter((counters *)CONCAT44(extraout_var_00,iVar2),c,1);
    }
    *(uint *)&this->field_0x600 = (*(uint *)&this->field_0x600 & 0xffffffe1) + (uVar1 & 0xf) * 2;
  }
  return;
}

Assistant:

void torrent::update_gauge()
	{
		int const new_gauge_state = current_stats_state() - counters::num_checking_torrents;
		TORRENT_ASSERT(new_gauge_state >= 0);
		TORRENT_ASSERT(new_gauge_state <= no_gauge_state);

		if (new_gauge_state == int(m_current_gauge_state)) return;

		if (m_current_gauge_state != no_gauge_state)
			inc_stats_counter(m_current_gauge_state + counters::num_checking_torrents, -1);
		if (new_gauge_state != no_gauge_state)
			inc_stats_counter(new_gauge_state + counters::num_checking_torrents, 1);

		TORRENT_ASSERT(new_gauge_state >= 0);
		TORRENT_ASSERT(new_gauge_state <= no_gauge_state);
		m_current_gauge_state = static_cast<std::uint32_t>(new_gauge_state);
	}